

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

int cimg_library::cimg::dialog<unsigned_char>
              (char *title,char *msg,char *button1_label,char *button2_label,char *button3_label,
              char *button4_label,char *button5_label,char *button6_label,CImg<unsigned_char> *logo,
              bool is_centered)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  ulong uVar4;
  ulong uVar5;
  CImgArgumentException *this;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *title_00;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint size_x;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  int l;
  int iVar19;
  uint uVar20;
  long lVar21;
  int x1;
  int x1_00;
  int x1_01;
  long lVar22;
  bool bVar23;
  bool bVar24;
  CImgList<unsigned_char> buttons;
  CImg<unsigned_char> canvas;
  CImg<unsigned_char> sbutton;
  CImgList<unsigned_char> sbuttons;
  CImgList<unsigned_char> cbuttons;
  uint xbuttons [6];
  CImg<unsigned_char> button;
  CImg<unsigned_char> cbutton;
  CImgDisplay disp;
  CImg<unsigned_char> local_50;
  
  buttons._width = 0;
  buttons._allocated_width = 0;
  buttons._data = (CImg<unsigned_char> *)0x0;
  cbuttons._width = 0;
  cbuttons._allocated_width = 0;
  cbuttons._data = (CImg<unsigned_char> *)0x0;
  sbuttons._width = 0;
  sbuttons._allocated_width = 0;
  sbuttons._data = (CImg<unsigned_char> *)0x0;
  if (button1_label != (char *)0x0) {
    disp._width = 0;
    disp._height = 0;
    disp._timer = 0;
    disp._fps_frames = 0;
    disp._fps_timer._0_1_ = 0;
    pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,button1_label,"",
                        dialog<unsigned_char>::gray,1.0,0xd);
    CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&buttons,0xffffffff);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
    if (button2_label != (char *)0x0) {
      disp._width = 0;
      disp._height = 0;
      disp._timer = 0;
      disp._fps_frames = 0;
      disp._fps_timer._0_1_ = 0;
      pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                         ((CImg<unsigned_char> *)&disp,0,0,button2_label,"",
                          dialog<unsigned_char>::gray,1.0,0xd);
      CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&buttons,0xffffffff);
      CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
      if (button3_label != (char *)0x0) {
        disp._width = 0;
        disp._height = 0;
        disp._timer = 0;
        disp._fps_frames = 0;
        disp._fps_timer._0_1_ = 0;
        pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                           ((CImg<unsigned_char> *)&disp,0,0,button3_label,"",
                            dialog<unsigned_char>::gray,1.0,0xd);
        CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&buttons,0xffffffff);
        CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
        if (button4_label != (char *)0x0) {
          disp._width = 0;
          disp._height = 0;
          disp._timer = 0;
          disp._fps_frames = 0;
          disp._fps_timer._0_1_ = 0;
          pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                             ((CImg<unsigned_char> *)&disp,0,0,button4_label,"",
                              dialog<unsigned_char>::gray,1.0,0xd);
          CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&buttons,0xffffffff);
          CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
          if (button5_label != (char *)0x0) {
            disp._width = 0;
            disp._height = 0;
            disp._timer = 0;
            disp._fps_frames = 0;
            disp._fps_timer._0_1_ = 0;
            pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                               ((CImg<unsigned_char> *)&disp,0,0,button5_label,"",
                                dialog<unsigned_char>::gray,1.0,0xd);
            CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&buttons,0xffffffff);
            CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
            if (button6_label != (char *)0x0) {
              disp._width = 0;
              disp._height = 0;
              disp._timer = 0;
              disp._fps_frames = 0;
              disp._fps_timer._0_1_ = 0;
              pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char,unsigned_char>
                                 ((CImg<unsigned_char> *)&disp,0,0,button6_label,"",
                                  dialog<unsigned_char>::gray,1.0,0xd);
              CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&buttons,0xffffffff);
              CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
            }
          }
        }
      }
    }
  }
  if (buttons._width == 0) {
    this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this,"cimg::dialog(): No buttons have been defined.");
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  lVar22 = 0;
  for (lVar21 = 0; lVar21 < (int)buttons._width; lVar21 = lVar21 + 1) {
    CImg<unsigned_char>::resize
              ((CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar22),-100,-100,1,3,1,0,
               0.0,0.0,0.0,0.0);
    lVar22 = lVar22 + 0x20;
  }
  uVar15 = 0;
  uVar4 = (ulong)buttons._width;
  if ((int)buttons._width < 1) {
    uVar4 = uVar15;
  }
  uVar6 = 0;
  uVar9 = 0;
  for (; uVar4 * 0x20 != uVar15; uVar15 = uVar15 + 0x20) {
    uVar11 = *(uint *)((long)&(buttons._data)->_width + uVar15);
    uVar10 = *(uint *)((long)&(buttons._data)->_height + uVar15);
    if (uVar9 <= uVar11) {
      uVar9 = uVar11;
    }
    if (uVar6 <= uVar10) {
      uVar6 = uVar10;
    }
  }
  uVar9 = uVar9 + 8;
  if (0x7f < uVar9) {
    uVar9 = 0x80;
  }
  uVar11 = 0x40;
  if (0x40 < uVar9) {
    uVar11 = uVar9;
  }
  uVar9 = 0x30;
  if (uVar6 + 8 < 0x30) {
    uVar9 = uVar6 + 8;
  }
  uVar6 = 0x18;
  if (0x18 < uVar9) {
    uVar6 = uVar9;
  }
  CImg<unsigned_char>::CImg(&button,uVar11,uVar6,1,3);
  iVar7 = uVar11 - 1;
  iVar18 = uVar6 - 1;
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (&button,0,0,iVar7,iVar18,dialog<unsigned_char>::gray,1.0);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&button,0,0,iVar7,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,0,iVar18,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&button,iVar7,0,iVar7,iVar18,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,iVar7,iVar18,0,iVar18,"",1.0,0xffffffff,true)
  ;
  iVar12 = uVar6 - 2;
  x1 = uVar11 - 2;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&button,1,iVar12,x1,iVar12,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,x1,iVar12,x1,1,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  CImg<unsigned_char>::CImg(&sbutton,uVar11,uVar6,1,3);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (&sbutton,0,0,iVar7,iVar18,dialog<unsigned_char>::gray,1.0);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,0,0,iVar7,0,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,iVar7,0,iVar7,iVar18,"",1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,iVar7,iVar18,0,iVar18,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,0,iVar18,0,0,"",1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,1,1,x1,1,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,1,iVar12,1,1,dialog<unsigned_char>::white,1.0,0xffffffff,true);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,x1,1,x1,iVar12,"",1.0,0xffffffff,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,x1,iVar12,1,iVar12,"",1.0,0xffffffff,true);
  iVar13 = uVar6 - 3;
  x1_01 = uVar11 - 3;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,2,iVar13,x1_01,iVar13,dialog<unsigned_char>::gray2,1.0,0xffffffff,
                      true);
  CImg<unsigned_char>::draw_line<unsigned_char>
            (pCVar3,x1_01,iVar13,x1_01,2,dialog<unsigned_char>::gray2,1.0,0xffffffff,true);
  x1_00 = uVar11 - 5;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,4,4,x1_00,4,"",1.0,0xaaaaaaaa,true);
  iVar19 = uVar6 - 5;
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,x1_00,4,x1_00,iVar19,"",1.0,0xaaaaaaaa,false)
  ;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&sbutton,x1_00,iVar19,4,iVar19,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,4,iVar19,4,4,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::CImg(&cbutton,uVar11,uVar6,1,3);
  pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>(&cbutton,0,0,iVar7,iVar18,"",1.0);
  pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                     (pCVar3,1,1,x1,iVar12,dialog<unsigned_char>::gray2,1.0);
  CImg<unsigned_char>::draw_rectangle<unsigned_char>
            (pCVar3,2,2,x1_01,iVar13,dialog<unsigned_char>::gray,1.0);
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&cbutton,4,4,x1_00,4,"",1.0,0xaaaaaaaa,true);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,x1_00,4,x1_00,iVar19,"",1.0,0xaaaaaaaa,false)
  ;
  pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                     (&cbutton,x1_00,iVar19,4,iVar19,"",1.0,0xaaaaaaaa,false);
  CImg<unsigned_char>::draw_line<unsigned_char>(pCVar3,4,iVar19,4,4,"",1.0,0xaaaaaaaa,false);
  lVar21 = 0;
  for (lVar22 = 0; lVar22 < (int)buttons._width; lVar22 = lVar22 + 1) {
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,&cbutton);
    pCVar3 = CImg<unsigned_char>::draw_image<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,
                        (uVar11 - *(int *)((long)&(buttons._data)->_width + lVar21) >> 1) + 1,
                        (uVar6 - *(int *)((long)&(buttons._data)->_height + lVar21) >> 1) + 1,
                        (CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),1.0);
    CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&cbuttons,0xffffffff);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,&sbutton);
    pCVar3 = CImg<unsigned_char>::draw_image<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,
                        uVar11 - *(int *)((long)&(buttons._data)->_width + lVar21) >> 1,
                        uVar6 - *(int *)((long)&(buttons._data)->_height + lVar21) >> 1,
                        (CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),1.0);
    CImg<unsigned_char>::move_to<unsigned_char>(pCVar3,&sbuttons,0xffffffff);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,&button);
    pCVar3 = CImg<unsigned_char>::draw_image<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,
                        uVar11 - *(int *)((long)&(buttons._data)->_width + lVar21) >> 1,
                        uVar6 - *(int *)((long)&(buttons._data)->_height + lVar21) >> 1,
                        (CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21),1.0);
    CImg<unsigned_char>::move_to
              (pCVar3,(CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar21));
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
    lVar21 = lVar21 + 0x20;
  }
  canvas._data = (uchar *)0x0;
  canvas._width = 0;
  canvas._height = 0;
  canvas._depth = 0;
  canvas._spectrum = 0;
  canvas._is_shared = false;
  if (msg == (char *)0x0) {
    uVar9 = 0;
    bVar23 = true;
    uVar10 = 0;
  }
  else {
    disp._width = 0;
    disp._height = 0;
    disp._timer = 0;
    disp._fps_frames = 0;
    disp._fps_timer._0_1_ = 0;
    pCVar3 = CImg<unsigned_char>::draw_text<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,"%s",dialog<unsigned_char>::gray,0,1.0,0xd,
                        msg);
    pCVar3 = CImg<unsigned_char>::operator*=(pCVar3,-1);
    pCVar3 = CImg<unsigned_char>::operator+=(pCVar3,200);
    pCVar3 = CImg<unsigned_char>::resize(pCVar3,-100,-100,1,3,1,0,0.0,0.0,0.0,0.0);
    CImg<unsigned_char>::move_to(pCVar3,&canvas);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
    uVar9 = canvas._height;
    bVar23 = canvas._data == (uchar *)0x0;
    uVar10 = canvas._width;
  }
  iVar7 = (buttons._width - 1) * (uVar11 + 0xc);
  uVar1 = logo->_width;
  uVar14 = uVar1 + uVar10 + 0x24;
  uVar20 = iVar7 + uVar11 + 0x18;
  uVar10 = uVar20;
  if (uVar20 < uVar14) {
    uVar10 = uVar14;
  }
  uVar2 = logo->_height;
  size_x = 0xc4;
  if (0xc4 < uVar10) {
    size_x = uVar10;
  }
  uVar8 = uVar9 + uVar6 + 0x24;
  uVar10 = uVar2 + uVar6 + 0x24;
  if (uVar10 < uVar8) {
    uVar10 = uVar8;
  }
  uVar8 = 0x60;
  if (0x60 < uVar10) {
    uVar8 = uVar10;
  }
  iVar13 = (uVar8 - 0xc) - uVar6;
  iVar12 = 0xc;
  if (bVar23) {
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,size_x,uVar8,1,3);
    iVar12 = size_x - 1;
    iVar18 = uVar8 - 1;
    pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,iVar12,iVar18,dialog<unsigned_char>::gray,
                        1.0);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,0,iVar12,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,iVar18,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar12,0,iVar12,iVar18,"",1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar12,iVar18,0,iVar18,"",1.0,0xffffffff,true);
    CImg<unsigned_char>::assign<unsigned_char>(&canvas,pCVar3);
    iVar12 = ((size_x - uVar1) - 0x18 >> 1) + 0xc;
  }
  else {
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&disp,size_x,uVar8,1,3);
    iVar18 = size_x - 1;
    iVar19 = uVar8 - 1;
    pCVar3 = CImg<unsigned_char>::draw_rectangle<unsigned_char>
                       ((CImg<unsigned_char> *)&disp,0,0,iVar18,iVar19,dialog<unsigned_char>::gray,
                        1.0);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,0,iVar18,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,0,iVar19,0,0,dialog<unsigned_char>::white,1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar18,0,iVar18,iVar19,"",1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_line<unsigned_char>
                       (pCVar3,iVar18,iVar19,0,iVar19,"",1.0,0xffffffff,true);
    pCVar3 = CImg<unsigned_char>::draw_image<unsigned_char>
                       (pCVar3,uVar1 + 0x18,iVar13 - uVar9 >> 1,&canvas,1.0);
    CImg<unsigned_char>::assign<unsigned_char>(&canvas,pCVar3);
  }
  CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&disp);
  if (logo->_data != (uchar *)0x0) {
    CImg<unsigned_char>::draw_image<unsigned_char>(&canvas,iVar12,iVar13 - uVar2 >> 1,logo,1.0);
  }
  xbuttons[4] = 0;
  xbuttons[5] = 0;
  if (uVar20 < uVar14) {
    uVar20 = uVar14;
  }
  uVar9 = 0xc4;
  if (0xc4 < uVar20) {
    uVar9 = uVar20;
  }
  xbuttons[0] = 0;
  xbuttons[1] = 0;
  xbuttons[2] = 0;
  xbuttons[3] = 0;
  uVar9 = (uVar9 - iVar7) - uVar11 >> 1;
  lVar22 = 0;
  for (lVar21 = 0; lVar21 < (int)buttons._width; lVar21 = lVar21 + 1) {
    xbuttons[lVar21] = uVar9;
    CImg<unsigned_char>::draw_image<unsigned_char>
              (&canvas,uVar9,iVar13,(CImg<unsigned_char> *)((long)&(buttons._data)->_width + lVar22)
               ,1.0);
    lVar22 = lVar22 + 0x20;
    uVar9 = uVar9 + uVar11 + 0xc;
  }
  title_00 = " ";
  if (title != (char *)0x0) {
    title_00 = title;
  }
  CImgDisplay::CImgDisplay<unsigned_char>(&disp,&canvas,title_00,0,false,is_centered);
  if (is_centered) {
    iVar7 = CImgDisplay::screen_width();
    uVar9 = disp._width;
    iVar12 = CImgDisplay::screen_height();
    CImgDisplay::move(&disp,(int)(iVar7 - uVar9) / 2,(int)(iVar12 - disp._height) / 2);
  }
  bVar24 = false;
  bVar23 = false;
  uVar4 = 0xffffffffffffffff;
  uVar15 = 0xffffffff;
LAB_0017f969:
  if ((disp._is_closed != false) || (bVar24)) {
    bVar23 = disp._width == 0;
    bVar24 = disp._height == 0;
    CImgDisplay::~CImgDisplay(&disp);
    CImg<unsigned_char>::~CImg(&canvas);
    CImg<unsigned_char>::~CImg(&cbutton);
    CImg<unsigned_char>::~CImg(&sbutton);
    CImg<unsigned_char>::~CImg(&button);
    CImgList<unsigned_char>::~CImgList(&sbuttons);
    CImgList<unsigned_char>::~CImgList(&cbuttons);
    CImgList<unsigned_char>::~CImgList(&buttons);
    return -(uint)bVar24 | (uint)uVar15 | -(uint)bVar23;
  }
  iVar7 = (int)uVar4;
  if (bVar23) {
    if (iVar7 < 0) {
      if ((int)(uint)uVar15 < 0) {
        CImgDisplay::display<unsigned_char>(&disp,&canvas);
        goto LAB_0017fa46;
      }
      CImg<unsigned_char>::CImg(&local_50,&canvas);
      pCVar3 = CImg<unsigned_char>::draw_image<unsigned_char>
                         (&local_50,xbuttons[uVar15],iVar13,sbuttons._data + uVar15,1.0);
      CImgDisplay::display<unsigned_char>(&disp,pCVar3);
    }
    else {
      CImg<unsigned_char>::CImg(&local_50,&canvas);
      pCVar3 = CImg<unsigned_char>::draw_image<unsigned_char>
                         (&local_50,xbuttons[uVar4 & 0xffffffff],iVar13,
                          cbuttons._data + (uVar4 & 0xffffffff),1.0);
      CImgDisplay::display<unsigned_char>(&disp,pCVar3);
    }
    CImg<unsigned_char>::~CImg(&local_50);
  }
LAB_0017fa46:
  wait((cimg *)0xf,&disp);
  if (disp._is_resized == true) {
    CImgDisplay::resize(&disp,&disp,false);
  }
  if (((byte)disp._button & 1) == 0) {
    bVar24 = -1 < iVar7;
    bVar23 = false;
  }
  else {
    uVar16 = 0;
    uVar5 = buttons._0_8_ & 0xffffffff;
    if ((int)buttons._width < 1) {
      uVar5 = uVar16;
    }
    bVar17 = 0;
    uVar4 = 0xffffffffffffffff;
    for (; uVar5 != uVar16; uVar16 = uVar16 + 1) {
      if (((disp._mouse_y < (int)(uVar8 - 0xc) && iVar13 <= disp._mouse_y) &&
          ((int)xbuttons[uVar16] <= disp._mouse_x)) &&
         (disp._mouse_x < (int)(xbuttons[uVar16] + uVar11))) {
        bVar17 = 1;
        uVar15 = uVar16 & 0xffffffff;
        uVar4 = uVar16 & 0xffffffff;
      }
    }
    bVar23 = (bool)((int)uVar4 != iVar7 | bVar17);
    bVar24 = false;
    uVar4 = uVar4 & 0xffffffff;
  }
  uVar9 = *disp._keys;
  uVar6 = (uint)uVar15;
  if (1 < uVar9 - 0xff51) {
    if (1 < uVar9 - 0xff53) goto code_r0x0017fb14;
    goto LAB_0017fb3c;
  }
  iVar7 = uVar6 + buttons._width + -1;
  goto LAB_0017fb54;
code_r0x0017fb14:
  if (uVar9 != 0) {
    if (uVar9 == 0xff09) {
LAB_0017fb3c:
      iVar7 = uVar6 + 1;
LAB_0017fb54:
      uVar10 = iVar7 % (int)buttons._width;
    }
    else if (uVar9 == 0xff0d) {
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar10 = uVar6;
      }
      bVar24 = true;
    }
    else {
      uVar10 = uVar6;
      if (uVar9 == 0xff1b) {
        bVar24 = true;
        uVar10 = 0xffffffff;
      }
    }
    CImgDisplay::set_key(&disp);
    bVar23 = (bool)(uVar10 != uVar6 | bVar23);
    uVar15 = (ulong)uVar10;
  }
  goto LAB_0017f969;
}

Assistant:

inline int dialog(const char *const title, const char *const msg,
                      const char *const button1_label, const char *const button2_label,
                      const char *const button3_label, const char *const button4_label,
                      const char *const button5_label, const char *const button6_label,
                      const CImg<t>& logo, const bool is_centered=false) {
#if cimg_display==0
      cimg::unused(title,msg,button1_label,button2_label,button3_label,button4_label,button5_label,button6_label,
                   logo._data,is_centered);
      throw CImgIOException("cimg::dialog(): No display available.");
#else
      static const unsigned char
        black[] = { 0,0,0 }, white[] = { 255,255,255 }, gray[] = { 200,200,200 }, gray2[] = { 150,150,150 };

      // Create buttons and canvas graphics
      CImgList<unsigned char> buttons, cbuttons, sbuttons;
      if (button1_label) {
        CImg<unsigned char>().draw_text(0,0,button1_label,black,gray,1,13).move_to(buttons);
        if (button2_label) {
          CImg<unsigned char>().draw_text(0,0,button2_label,black,gray,1,13).move_to(buttons);
          if (button3_label) {
            CImg<unsigned char>().draw_text(0,0,button3_label,black,gray,1,13).move_to(buttons);
            if (button4_label) {
              CImg<unsigned char>().draw_text(0,0,button4_label,black,gray,1,13).move_to(buttons);
              if (button5_label) {
                CImg<unsigned char>().draw_text(0,0,button5_label,black,gray,1,13).move_to(buttons);
                if (button6_label) {
                  CImg<unsigned char>().draw_text(0,0,button6_label,black,gray,1,13).move_to(buttons);
                }}}}}}
      if (!buttons._width)
        throw CImgArgumentException("cimg::dialog(): No buttons have been defined.");
      cimglist_for(buttons,l) buttons[l].resize(-100,-100,1,3);

      unsigned int bw = 0, bh = 0;
      cimglist_for(buttons,l) { bw = std::max(bw,buttons[l]._width); bh = std::max(bh,buttons[l]._height); }
      bw+=8; bh+=8;
      if (bw<64) bw = 64;
      if (bw>128) bw = 128;
      if (bh<24) bh = 24;
      if (bh>48) bh = 48;

      CImg<unsigned char> button(bw,bh,1,3);
      button.draw_rectangle(0,0,bw - 1,bh - 1,gray);
      button.draw_line(0,0,bw - 1,0,white).draw_line(0,bh - 1,0,0,white);
      button.draw_line(bw - 1,0,bw - 1,bh - 1,black).draw_line(bw - 1,bh - 1,0,bh - 1,black);
      button.draw_line(1,bh - 2,bw - 2,bh - 2,gray2).draw_line(bw - 2,bh - 2,bw - 2,1,gray2);
      CImg<unsigned char> sbutton(bw,bh,1,3);
      sbutton.draw_rectangle(0,0,bw - 1,bh - 1,gray);
      sbutton.draw_line(0,0,bw - 1,0,black).draw_line(bw - 1,0,bw - 1,bh - 1,black);
      sbutton.draw_line(bw - 1,bh - 1,0,bh - 1,black).draw_line(0,bh - 1,0,0,black);
      sbutton.draw_line(1,1,bw - 2,1,white).draw_line(1,bh - 2,1,1,white);
      sbutton.draw_line(bw - 2,1,bw - 2,bh - 2,black).draw_line(bw - 2,bh - 2,1,bh - 2,black);
      sbutton.draw_line(2,bh - 3,bw - 3,bh - 3,gray2).draw_line(bw - 3,bh - 3,bw - 3,2,gray2);
      sbutton.draw_line(4,4,bw - 5,4,black,1,0xAAAAAAAA,true).
        draw_line(bw - 5,4,bw - 5,bh - 5,black,1,0xAAAAAAAA,false);
      sbutton.draw_line(bw - 5,bh - 5,4,bh - 5,black,1,0xAAAAAAAA,false).
        draw_line(4,bh - 5,4,4,black,1,0xAAAAAAAA,false);
      CImg<unsigned char> cbutton(bw,bh,1,3);
      cbutton.draw_rectangle(0,0,bw - 1,bh - 1,black).draw_rectangle(1,1,bw - 2,bh - 2,gray2).
        draw_rectangle(2,2,bw - 3,bh - 3,gray);
      cbutton.draw_line(4,4,bw - 5,4,black,1,0xAAAAAAAA,true).
        draw_line(bw - 5,4,bw - 5,bh - 5,black,1,0xAAAAAAAA,false);
      cbutton.draw_line(bw - 5,bh - 5,4,bh - 5,black,1,0xAAAAAAAA,false).
        draw_line(4,bh - 5,4,4,black,1,0xAAAAAAAA,false);

      cimglist_for(buttons,ll) {
        CImg<unsigned char>(cbutton).
          draw_image(1 + (bw  -buttons[ll].width())/2,1 + (bh - buttons[ll].height())/2,buttons[ll]).
          move_to(cbuttons);
        CImg<unsigned char>(sbutton).
          draw_image((bw - buttons[ll].width())/2,(bh - buttons[ll].height())/2,buttons[ll]).
          move_to(sbuttons);
        CImg<unsigned char>(button).
          draw_image((bw - buttons[ll].width())/2,(bh - buttons[ll].height())/2,buttons[ll]).
          move_to(buttons[ll]);
      }

      CImg<unsigned char> canvas;
      if (msg)
        ((CImg<unsigned char>().draw_text(0,0,"%s",gray,0,1,13,msg)*=-1)+=200).resize(-100,-100,1,3).move_to(canvas);

      const unsigned int
        bwall = (buttons._width - 1)*(12 + bw) + bw,
        w = cimg::max(196U,36 + logo._width + canvas._width,24 + bwall),
        h = cimg::max(96U,36 + canvas._height + bh,36 + logo._height + bh),
        lx = 12 + (canvas._data?0:((w - 24 - logo._width)/2)),
        ly = (h - 12 - bh - logo._height)/2,
        tx = lx + logo._width + 12,
        ty = (h - 12 - bh - canvas._height)/2,
        bx = (w - bwall)/2,
        by = h - 12 - bh;

      if (canvas._data)
        canvas = CImg<unsigned char>(w,h,1,3).
          draw_rectangle(0,0,w - 1,h - 1,gray).
          draw_line(0,0,w - 1,0,white).draw_line(0,h - 1,0,0,white).
          draw_line(w - 1,0,w - 1,h - 1,black).draw_line(w - 1,h - 1,0,h - 1,black).
          draw_image(tx,ty,canvas);
      else
        canvas = CImg<unsigned char>(w,h,1,3).
          draw_rectangle(0,0,w - 1,h - 1,gray).
          draw_line(0,0,w - 1,0,white).draw_line(0,h - 1,0,0,white).
          draw_line(w - 1,0,w - 1,h - 1,black).draw_line(w - 1,h - 1,0,h - 1,black);
      if (logo._data) canvas.draw_image(lx,ly,logo);

      unsigned int xbuttons[6] = { 0 };
      cimglist_for(buttons,lll) {
        xbuttons[lll] = bx + (bw + 12)*lll;
        canvas.draw_image(xbuttons[lll],by,buttons[lll]);
      }

      // Open window and enter events loop
      CImgDisplay disp(canvas,title?title:" ",0,false,is_centered?true:false);
      if (is_centered) disp.move((CImgDisplay::screen_width() - disp.width())/2,
                                 (CImgDisplay::screen_height() - disp.height())/2);
      bool stop_flag = false, refresh = false;
      int oselected = -1, oclicked = -1, selected = -1, clicked = -1;
      while (!disp.is_closed() && !stop_flag) {
        if (refresh) {
          if (clicked>=0)
            CImg<unsigned char>(canvas).draw_image(xbuttons[clicked],by,cbuttons[clicked]).display(disp);
          else {
            if (selected>=0)
              CImg<unsigned char>(canvas).draw_image(xbuttons[selected],by,sbuttons[selected]).display(disp);
            else canvas.display(disp);
          }
          refresh = false;
        }
        disp.wait(15);
        if (disp.is_resized()) disp.resize(disp,false);

        if (disp.button()&1)  {
          oclicked = clicked;
          clicked = -1;
          cimglist_for(buttons,l)
            if (disp.mouse_y()>=(int)by && disp.mouse_y()<(int)(by + bh) &&
                disp.mouse_x()>=(int)xbuttons[l] && disp.mouse_x()<(int)(xbuttons[l] + bw)) {
              clicked = selected = l;
              refresh = true;
            }
          if (clicked!=oclicked) refresh = true;
        } else if (clicked>=0) stop_flag = true;

        if (disp.key()) {
          oselected = selected;
          switch (disp.key()) {
          case cimg::keyESC : selected = -1; stop_flag = true; break;
          case cimg::keyENTER : if (selected<0) selected = 0; stop_flag = true; break;
          case cimg::keyTAB :
          case cimg::keyARROWRIGHT :
          case cimg::keyARROWDOWN : selected = (selected + 1)%buttons.width(); break;
          case cimg::keyARROWLEFT :
          case cimg::keyARROWUP : selected = (selected + buttons.width() - 1)%buttons.width(); break;
          }
          disp.set_key();
          if (selected!=oselected) refresh = true;
        }
      }
      if (!disp) selected = -1;
      return selected;
#endif
    }